

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

reference<mpt::pipe<int>::instance> * __thiscall mpt::pipe<int>::ref(pipe<int> *this)

{
  instance *piVar1;
  pipe<int> *this_local;
  
  piVar1 = reference<mpt::pipe<int>::instance>::instance(&this->_d);
  if (piVar1 == (instance *)0x0) {
    piVar1 = (instance *)operator_new(0x30);
    instance::instance(piVar1);
    reference<mpt::pipe<int>::instance>::set_instance(&this->_d,piVar1);
  }
  return &this->_d;
}

Assistant:

const reference<instance> &ref()
	{
		if (!_d.instance()) {
			_d.set_instance(new instance);
		}
		return _d;
	}